

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

IndexPair __thiscall
slang::IntervalMap<unsigned_long,slang::ast::Expression_const*,5u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,5u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,8u,false>,true>
          (IntervalMap<unsigned_long,slang::ast::Expression_const*,5u> *this,
          LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true> *rootNode,
          uint32_t position,allocator_type *alloc)

{
  interval<unsigned_long> *piVar1;
  unsigned_long *puVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  IndexPair IVar7;
  LeafNode<unsigned_long,_const_slang::ast::Expression_*,_8U,_false> *pLVar8;
  long lVar9;
  uint uVar10;
  uint32_t uVar11;
  undefined8 *puVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  uint32_t sizes [2];
  NodeRef nodes [2];
  uint32_t local_50 [2];
  ulong local_48 [3];
  
  IVar7 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0x7c),8,local_50,position);
  local_48[0] = 0;
  local_48[1] = 0;
  uVar10 = 0;
  lVar9 = 0;
  do {
    pLVar8 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    uVar3 = local_50[lVar9];
    if (uVar3 != 0) {
      lVar13 = 0;
      uVar11 = uVar3;
      uVar15 = uVar10;
      do {
        piVar1 = (rootNode->
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                 ).first + uVar15;
        uVar6 = piVar1->right;
        puVar2 = (unsigned_long *)
                 ((long)&(pLVar8->
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>
                         ).first[0].left + lVar13 * 2);
        *puVar2 = piVar1->left;
        puVar2[1] = uVar6;
        *(Expression **)
         ((long)(pLVar8->
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>
                ).second + lVar13) =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
             ).second[uVar15];
        uVar15 = uVar15 + 1;
        lVar13 = lVar13 + 8;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    uVar10 = uVar10 + uVar3;
    local_48[lVar9] = (ulong)pLVar8 & 0xffffffffffffffc0 | (ulong)(uVar3 - 1);
    bVar16 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar16);
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  lVar9 = 0;
  do {
    uVar4 = local_48[lVar9];
    puVar12 = (undefined8 *)(uVar4 & 0xffffffffffffffc0);
    uVar14 = puVar12[1];
    if (1 < (ulong)local_50[lVar9]) {
      lVar13 = 0;
      do {
        uVar5 = *(ulong *)((long)puVar12 + lVar13 + 0x18);
        if (uVar14 <= uVar5) {
          uVar14 = uVar5;
        }
        lVar13 = lVar13 + 0x10;
      } while ((ulong)local_50[lVar9] * 0x10 + -0x10 != lVar13);
    }
    *(undefined8 *)(this + lVar9 * 0x10 + 0x28) = *puVar12;
    *(ulong *)(this + lVar9 * 0x10 + 0x30) = uVar14;
    *(ulong *)(this + lVar9 * 8) = uVar4;
    bVar16 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar16);
  *(undefined4 *)(this + 0x7c) = 2;
  *(int *)(this + 0x78) = *(int *)(this + 0x78) + 1;
  return IVar7;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}